

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

void ly_vlog(ly_ctx *ctx,char *apptag,LY_VECODE code,char *format,...)

{
  char in_AL;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  uint64_t line;
  char *schema_path;
  char *data_path;
  va_list ap;
  undefined1 local_d8 [32];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  data_path = (char *)0x0;
  schema_path = (char *)0x0;
  line = 0;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (ctx != (ly_ctx *)0x0) {
    ly_vlog_build_path_line(ctx,&data_path,&schema_path,&line);
  }
  ap[0].reg_save_area = local_d8;
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].gp_offset = 0x20;
  ap[0].fp_offset = 0x30;
  log_vprintf(ctx,LY_LLERR,LY_EVALID,code,data_path,schema_path,line,apptag,format,ap);
  return;
}

Assistant:

void
ly_vlog(const struct ly_ctx *ctx, const char *apptag, LY_VECODE code, const char *format, ...)
{
    va_list ap;
    char *data_path = NULL, *schema_path = NULL;
    uint64_t line = 0;

    if (ctx) {
        ly_vlog_build_path_line(ctx, &data_path, &schema_path, &line);
    }

    va_start(ap, format);
    log_vprintf(ctx, LY_LLERR, LY_EVALID, code, data_path, schema_path, line, apptag, format, ap);
    /* path is spent and should not be freed! */
    va_end(ap);
}